

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.hh
# Opt level: O0

void __thiscall avro::Exception::~Exception(Exception *this)

{
  Exception *in_RDI;
  
  ~Exception(in_RDI,&VTT);
  std::runtime_error::~runtime_error((runtime_error *)&in_RDI->field_0x8);
  return;
}

Assistant:

class AVRO_DECL Exception : public virtual std::runtime_error
{
  public:

    Exception(const std::string &msg) :
        std::runtime_error(msg)
    { }

    Exception(const boost::format &msg) :
        std::runtime_error( boost::str(msg))
    { }  
}